

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  _Bool _Var1;
  uint uVar2;
  CURLMcode CVar3;
  uint uVar4;
  uint uVar5;
  _Bool recursive;
  int newstate;
  int oldstate;
  CURLcode result;
  SingleRequest *k;
  int action_local;
  Curl_easy *data_local;
  
  newstate = 0;
  if (((data == (Curl_easy *)0x0) || (data->magic != 0xc0dedbad)) ||
     (data->conn == (connectdata *)0x0)) {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    _Var1 = Curl_is_in_callback(data);
    uVar4 = 0;
    if ((action & 1U) != 0) {
      uVar4 = 0x10;
    }
    uVar5 = 0;
    if ((action & 4U) != 0) {
      uVar5 = 0x20;
    }
    uVar2 = (data->req).keepon & 0xffffffcfU | uVar4 | uVar5;
    if ((uVar4 | uVar5) == ((data->req).keepon & 0x30U)) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      if (((((data->req).keepon & (uVar2 ^ 0xffffffff) & 0x20) != 0) &&
          ((data->mstate == MSTATE_PERFORMING || (data->mstate == MSTATE_RATELIMITING)))) &&
         ((data->state).fread_func == Curl_mime_read)) {
        Curl_mime_unpause((curl_mimepart *)(data->state).in);
      }
      (data->req).keepon = uVar2;
      if (uVar4 == 0) {
        Curl_conn_ev_data_pause(data,false);
        newstate = Curl_client_unpause(data);
        if (newstate != CURLE_OK) {
          return newstate;
        }
      }
      if ((uVar4 | uVar5) != 0x30) {
        Curl_expire(data,0,EXPIRE_RUN_NOW);
        (data->state).keeps_speed.tv_sec = 0;
        if ((data->state).tempcount == 0) {
          (data->state).select_bits = '\x03';
        }
        if ((data->multi != (Curl_multi *)0x0) &&
           (CVar3 = Curl_update_timer(data->multi), CVar3 != CURLM_OK)) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
      }
      if ((*(uint *)&(data->state).field_0x74c >> 0xb & 1) == 0) {
        newstate = Curl_updatesocket(data);
      }
      if (_Var1) {
        Curl_set_in_callback(data,true);
      }
      data_local._4_4_ = newstate;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k;
  CURLcode result = CURLE_OK;
  int oldstate;
  int newstate;
  bool recursive = FALSE;

  if(!GOOD_EASY_HANDLE(data) || !data->conn)
    /* crazy input, don't continue */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(Curl_is_in_callback(data))
    recursive = TRUE;
  k = &data->req;
  oldstate = k->keepon & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* first switch off both pause bits then set the new pause bits */
  newstate = (k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) |
    ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  if((newstate & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) == oldstate) {
    /* Not changing any pause state, return */
    DEBUGF(infof(data, "pause: no change, early return"));
    return CURLE_OK;
  }

  /* Unpause parts in active mime tree. */
  if((k->keepon & ~newstate & KEEP_SEND_PAUSE) &&
     (data->mstate == MSTATE_PERFORMING ||
      data->mstate == MSTATE_RATELIMITING) &&
     data->state.fread_func == (curl_read_callback) Curl_mime_read) {
    Curl_mime_unpause(data->state.in);
  }

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE)) {
    Curl_conn_ev_data_pause(data, FALSE);
    result = Curl_client_unpause(data);
    if(result)
      return result;
  }

#ifdef USE_HYPER
  if(!(newstate & KEEP_SEND_PAUSE)) {
    /* need to wake the send body waker */
    if(data->hyp.send_body_waker) {
      hyper_waker_wake(data->hyp.send_body_waker);
      data->hyp.send_body_waker = NULL;
    }
  }
#endif

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if((newstate & (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
     (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) {
    Curl_expire(data, 0, EXPIRE_RUN_NOW); /* get this handle going again */

    /* reset the too-slow time keeper */
    data->state.keeps_speed.tv_sec = 0;

    if(!data->state.tempcount)
      /* if not pausing again, force a recv/send check of this connection as
         the data might've been read off the socket already */
      data->state.select_bits = CURL_CSELECT_IN | CURL_CSELECT_OUT;
    if(data->multi) {
      if(Curl_update_timer(data->multi))
        return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  if(!data->state.done)
    /* This transfer may have been moved in or out of the bundle, update the
       corresponding socket callback, if used */
    result = Curl_updatesocket(data);

  if(recursive)
    /* this might have called a callback recursively which might have set this
       to false again on exit */
    Curl_set_in_callback(data, TRUE);

  return result;
}